

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O2

void __thiscall VectorsTest_Int3Product_Test::TestBody(VectorsTest_Int3Product_Test *this)

{
  char *pcVar1;
  AssertHelper AStack_48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  int local_38 [2];
  AssertionResult gtest_ar;
  int local_20 [4];
  
  local_20[0] = 0x12;
  local_20[1] = -0x28;
  local_38[0] = -4;
  local_40.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffd800000012
  ;
  local_20[2] = local_38[0];
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"res.x","Int3(18, -40, -4).x",local_20,(int *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
               ,0x4d,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_40.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0xffffffd800000012;
    local_38[0] = -4;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"res.y","Int3(18, -40, -4).y",local_20 + 1,
               (int *)((long)&local_40.ptr_ + 4));
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_40.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffd800000012;
      local_38[0] = -4;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"res.z","Int3(18, -40, -4).z",local_20 + 2,local_38);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_40);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
                   ,0x4d,pcVar1);
        testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper(&AStack_48);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_40);
      }
      goto LAB_00186ec6;
    }
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
               ,0x4d,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_48);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_40);
LAB_00186ec6:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(VectorsTest, Int3Product)
{
    Int3 v1(3, 5, -2), v2(6, -8, 2);
    Int3 res = v1 * v2;
    ASSERT_EQ_INT3(res, Int3(18, -40, -4));
}